

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

object_ptr __thiscall mjs::new_string(mjs *this,gc_heap_ptr<mjs::global_object> *global,string *val)

{
  string *args;
  long *plVar1;
  void *pvVar2;
  undefined8 extraout_RDX;
  object_ptr oVar3;
  object_ptr proto;
  gc_heap_ptr_untyped local_50;
  undefined1 local_40 [16];
  
  plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar1 + 0x68))(&local_50,plVar1);
  pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  args = *(string **)((long)pvVar2 + 8);
  gc_heap_ptr_untyped::get(&local_50);
  object::class_name((object *)local_40);
  gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  gc_heap::
  make<mjs::string_object,mjs::string,mjs::gc_heap_ptr<mjs::object>&,mjs::string_const&,bool>
            ((gc_heap *)&stack0xffffffffffffffd0,args,(gc_heap_ptr<mjs::object> *)local_40,
             (string *)&local_50,(bool *)val);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,(gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_string(const gc_heap_ptr<global_object>& global, const string& val) {
    auto proto = global->string_prototype();
    return global->heap().make<string_object>(proto->class_name(), proto, val, global->language_version() >= version::es5);
}